

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsg.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int sock;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  uint *puVar6;
  char local_208 [8];
  char socket_address [128];
  void *buf;
  uchar *data;
  nn_cmsghdr *cmsg;
  uchar ctrl [256];
  undefined1 local_5b [3];
  undefined1 *puStack_58;
  uchar body [3];
  nn_iovec iovec;
  nn_msghdr hdr;
  int req;
  int rep;
  int rc;
  char **argv_local;
  int argc_local;
  
  iVar2 = get_test_port(argc,argv);
  test_addr_from(local_208,"tcp","127.0.0.1",iVar2);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                           ,0x30,2,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                 ,0x31,iVar2,local_208);
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                          ,0x32,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                    ,0x33,sock,local_208);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                 ,0x37,sock,"ABC");
  puStack_58 = local_5b;
  iovec.iov_base = (void *)0x3;
  iovec.iov_len = (size_t)&stack0xffffffffffffffa8;
  iVar3 = nn_recvmsg(iVar2,&iovec.iov_len,0);
  pFVar1 = _stderr;
  if (iVar3 != 3) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x40);
    fflush(_stderr);
    nn_err_abort();
  }
  data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,0);
  while( true ) {
    if (data == (uchar *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","cmsg",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
              ,0x44);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(int *)(data + 8) == 1) && (*(int *)(data + 0xc) == 1)) break;
    data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,data);
  }
  if (*(long *)data != 0x20) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x49);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((data[0x18] & 0x80) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(data[0+sizeof (size_t)] & 0x80)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x4b);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((data[0x1c] & 0x80) == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","data[4+sizeof (size_t)] & 0x80",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x4c);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar3 = nn_sendmsg(iVar2,&iovec.iov_len,0);
  if (iVar3 != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 3",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                 ,0x50,sock,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                 ,0x54,sock,"ABC");
  puStack_58 = local_5b;
  iovec.iov_base = (void *)0x3;
  iovec.iov_len = (size_t)&stack0xffffffffffffffa8;
  iVar3 = nn_recvmsg(iVar2,&iovec.iov_len,0);
  pFVar1 = _stderr;
  if (iVar3 != 3) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x5d);
    fflush(_stderr);
    nn_err_abort();
  }
  data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,0);
  while( true ) {
    if (data == (uchar *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","cmsg",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
              ,0x61);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(int *)(data + 8) == 1) && (*(int *)(data + 0xc) == 1)) break;
    data = (uchar *)nn_cmsg_nxthdr_(&iovec.iov_len,data);
  }
  if (*(long *)data != 0x20) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x66);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((data[0x18] & 0x80) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(data[0+sizeof (size_t)] & 0x80)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x68);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((data[0x1c] & 0x80) == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","data[4+sizeof (size_t)] & 0x80",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x69);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar3 = nn_sendmsg(iVar2,&iovec.iov_len,0);
  if (iVar3 != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 3",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            0x6c);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                 ,0x6d,sock,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                  ,0x6f,sock);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c"
                  ,0x70,iVar2);
  return 0;
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int rep;
    int req;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    unsigned char ctrl [256];
    struct nn_cmsghdr *cmsg;
    unsigned char *data;
    void *buf;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));
    
    rep = test_socket (AF_SP_RAW, NN_REP);
    test_bind (rep, socket_address);
    req = test_socket (AF_SP, NN_REQ);
    test_connect (req, socket_address);

    /* Test ancillary data in static buffer. */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = ctrl;
    hdr.msg_controllen = sizeof (ctrl);
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    /* Test ancillary data in dynamically allocated buffer (NN_MSG). */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &buf;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    test_close (req);
    test_close (rep);

    return 0;
}